

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.c
# Opt level: O1

void * cgreen_vector_get(CgreenVector *vector,int position)

{
  int iVar1;
  
  if (-1 < position) {
    if (vector == (CgreenVector *)0x0) {
      iVar1 = 0;
    }
    else {
      iVar1 = vector->size;
    }
    if (position <= iVar1) {
      return vector->items[(uint)position];
    }
  }
  panic("src/vector.c",0x4e,"CGREEN INTERNAL ERROR: illegal position (%d) in vector operation");
}

Assistant:

void *cgreen_vector_get(const CgreenVector *vector, int position) {
    if (position < 0 || position > cgreen_vector_size(vector)) {
        PANIC("CGREEN INTERNAL ERROR: illegal position (%d) in vector operation", position);
        return NULL;
    }
    return vector->items[position];
}